

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStairsEx<ImPlot::GetterYs<unsigned_short>>
               (char *label_id,GetterYs<unsigned_short> *getter)

{
  GetterYs<unsigned_short> getter_00;
  GetterYs<unsigned_short> getter_01;
  GetterYs<unsigned_short> getter_02;
  GetterYs<unsigned_short> getter_03;
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  TransformerLinLog local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  TransformerLogLin local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  TransformerLinLin local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ImU32 local_5c;
  ImU32 local_58;
  ImU32 col_fill;
  ImU32 col_line_1;
  TransformerLogLin local_4c;
  TransformerLinLin local_48;
  ImU32 local_44;
  ImDrawList *pIStack_40;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint p;
  int i;
  GetterYs<unsigned_short> *getter_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,0);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (p.y._4_4_ = 0; p.y._4_4_ < getter->Count; p.y._4_4_ = p.y._4_4_ + 1) {
        _s = GetterYs<unsigned_short>::operator()(getter,p.y._4_4_);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_40 = GetPlotDrawList();
    if ((1 < getter->Count) && (((ulong)(DrawList->_TextureIdStack).Data & 0x100000000) != 0)) {
      local_44 = ImGui::GetColorU32((ImVec4 *)DrawList);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_48);
        RenderStairs<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLin>
                  (getter,&local_48,pIStack_40,*(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_4c);
        RenderStairs<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLogLin>
                  (getter,&local_4c,pIStack_40,*(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog((TransformerLinLog *)&col_line_1);
        RenderStairs<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLog>
                  (getter,(TransformerLinLog *)&col_line_1,pIStack_40,
                   *(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog((TransformerLogLog *)&col_fill);
        RenderStairs<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)&col_fill,pIStack_40,
                   *(float *)&DrawList->_IdxWritePtr,local_44);
      }
    }
    if (*(int *)((long)&DrawList->_IdxWritePtr + 4) != -1) {
      PopPlotClipRect();
      PushPlotClipRect((float)(DrawList->_ClipRectStack).Size);
      local_58 = ImGui::GetColorU32((ImVec4 *)&DrawList->VtxBuffer);
      local_5c = ImGui::GetColorU32((ImVec4 *)&DrawList->Flags);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        memcpy(&local_88,getter,0x28);
        TransformerLinLin::TransformerLinLin(&local_8c);
        getter_00._8_8_ = uStack_80;
        getter_00.Ys = (unsigned_short *)local_88;
        getter_00.XScale = (double)local_78;
        getter_00.X0 = (double)uStack_70;
        getter_00.Offset = (undefined4)local_68;
        getter_00.Stride = local_68._4_4_;
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_short>>
                  (getter_00,local_8c,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 1:
        memcpy(&local_b8,getter,0x28);
        TransformerLogLin::TransformerLogLin(&local_bc);
        getter_01._8_8_ = uStack_b0;
        getter_01.Ys = (unsigned_short *)local_b8;
        getter_01.XScale = (double)local_a8;
        getter_01.X0 = (double)uStack_a0;
        getter_01.Offset = (undefined4)local_98;
        getter_01.Stride = local_98._4_4_;
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_short>>
                  (getter_01,local_bc,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 2:
        memcpy(&local_e8,getter,0x28);
        TransformerLinLog::TransformerLinLog(&local_ec);
        getter_02._8_8_ = uStack_e0;
        getter_02.Ys = (unsigned_short *)local_e8;
        getter_02.XScale = (double)local_d8;
        getter_02.X0 = (double)uStack_d0;
        getter_02.Offset = (undefined4)local_c8;
        getter_02.Stride = local_c8._4_4_;
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_short>>
                  (getter_02,local_ec,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 3:
        memcpy(&local_118,getter,0x28);
        TransformerLogLog::TransformerLogLog(&local_11c);
        getter_03._8_8_ = uStack_110;
        getter_03.Ys = (unsigned_short *)local_118;
        getter_03.XScale = (double)local_108;
        getter_03.X0 = (double)uStack_100;
        getter_03.Offset = (undefined4)local_f8;
        getter_03.Stride = local_f8._4_4_;
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_short>>
                  (getter_03,local_11c,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotStairsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderStairs(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderStairs(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderStairs(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderStairs(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}